

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

bool __thiscall HighsLpRelaxation::checkDualProof(HighsLpRelaxation *this)

{
  int iVar1;
  size_type sVar2;
  HighsLp *pHVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  HighsCDouble *in_RDI;
  HighsInt col;
  HighsInt i;
  HighsLp *lp;
  HighsCDouble viol;
  HighsInt len;
  double in_stack_ffffffffffffffa8;
  HighsCDouble *in_stack_ffffffffffffffb0;
  value_type in_stack_ffffffffffffffb8;
  int local_34;
  HighsCDouble local_28;
  int local_14;
  bool local_1;
  
  if (((ulong)in_RDI[0x535].lo & 1) == 0) {
    local_1 = true;
  }
  else if ((in_RDI[0x535].hi != INFINITY) || (NAN(in_RDI[0x535].hi))) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x521));
    local_14 = (int)sVar2;
    HighsCDouble::HighsCDouble(&local_28,-in_RDI[0x535].hi);
    pHVar3 = Highs::getLp((Highs *)&in_RDI->lo);
    for (local_34 = 0; local_34 != local_14; local_34 = local_34 + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x521),(long)local_34);
      iVar1 = *pvVar4;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&in_RDI[0x51f].lo,
                          (long)local_34);
      if (*pvVar5 <= 0.0) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&pHVar3->col_upper_,(long)iVar1);
        if ((*pvVar5 == INFINITY) && (!NAN(*pvVar5))) {
          return false;
        }
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&in_RDI[0x51f].lo,
                            (long)local_34);
        in_stack_ffffffffffffffb0 = (HighsCDouble *)*pvVar5;
        std::vector<double,_std::allocator<double>_>::operator[](&pHVar3->col_upper_,(long)iVar1);
        HighsCDouble::operator+=(in_RDI,in_stack_ffffffffffffffb8);
      }
      else {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&pHVar3->col_lower_,(long)iVar1);
        if ((*pvVar5 == -INFINITY) && (!NAN(*pvVar5))) {
          return false;
        }
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&in_RDI[0x51f].lo,
                            (long)local_34);
        in_stack_ffffffffffffffb8 = *pvVar5;
        std::vector<double,_std::allocator<double>_>::operator[](&pHVar3->col_lower_,(long)iVar1);
        HighsCDouble::operator+=(in_RDI,in_stack_ffffffffffffffb8);
      }
    }
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x6084a3)
    ;
    local_1 = HighsCDouble::operator>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool HighsLpRelaxation::checkDualProof() const {
  if (!hasdualproof) return true;
  if (dualproofrhs == kHighsInf) return false;

  HighsInt len = dualproofinds.size();

  HighsCDouble viol = -dualproofrhs;

  const HighsLp& lp = lpsolver.getLp();

  for (HighsInt i = 0; i != len; ++i) {
    HighsInt col = dualproofinds[i];
    if (dualproofvals[i] > 0) {
      if (lp.col_lower_[col] == -kHighsInf) return false;
      viol += dualproofvals[i] * lp.col_lower_[col];
    } else {
      assert(dualproofvals[i] < 0);
      if (lp.col_upper_[col] == kHighsInf) return false;
      viol += dualproofvals[i] * lp.col_upper_[col];
    }
  }

  return viol > mipsolver.mipdata_->feastol;
}